

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O1

void Map_MappingDfs_rec(Map_Node_t *pNode,Map_NodeVec_t *vNodes,int fCollectEquiv)

{
  int iVar1;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Map_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperUtils.c"
                  ,0x3a,"void Map_MappingDfs_rec(Map_Node_t *, Map_NodeVec_t *, int)");
  }
  if ((pNode->field_0x1c & 1) == 0) {
    iVar1 = Map_NodeIsAnd(pNode);
    if (iVar1 != 0) {
      Map_MappingDfs_rec((Map_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe),vNodes,fCollectEquiv)
      ;
      Map_MappingDfs_rec((Map_Node_t *)((ulong)pNode->p2 & 0xfffffffffffffffe),vNodes,fCollectEquiv)
      ;
    }
    if ((fCollectEquiv != 0) && (pNode->pNextE != (Map_Node_t *)0x0)) {
      Map_MappingDfs_rec(pNode->pNextE,vNodes,fCollectEquiv);
    }
    if ((*(uint *)&pNode->field_0x1c & 1) == 0) {
      *(uint *)&pNode->field_0x1c = *(uint *)&pNode->field_0x1c | 1;
      Map_NodeVecPush(vNodes,pNode);
      return;
    }
    __assert_fail("pNode->fMark0 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperUtils.c"
                  ,0x47,"void Map_MappingDfs_rec(Map_Node_t *, Map_NodeVec_t *, int)");
  }
  return;
}

Assistant:

void Map_MappingDfs_rec( Map_Node_t * pNode, Map_NodeVec_t * vNodes, int fCollectEquiv )
{
    assert( !Map_IsComplement(pNode) );
    if ( pNode->fMark0 )
        return;
    // visit the transitive fanin
    if ( Map_NodeIsAnd(pNode) )
    {
        Map_MappingDfs_rec( Map_Regular(pNode->p1), vNodes, fCollectEquiv );
        Map_MappingDfs_rec( Map_Regular(pNode->p2), vNodes, fCollectEquiv );
    }
    // visit the equivalent nodes
    if ( fCollectEquiv && pNode->pNextE )
        Map_MappingDfs_rec( pNode->pNextE, vNodes, fCollectEquiv );
    // make sure the node is not visited through the equivalent nodes
    assert( pNode->fMark0 == 0 );
    // mark the node as visited
    pNode->fMark0 = 1;
    // add the node to the list
    Map_NodeVecPush( vNodes, pNode );
}